

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

Texture2DView
tcu::getEffectiveTView<tcu::Texture2DView>
          (Texture2DView *src,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *storage
          ,Sampler *sampler)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  ConstPixelBufferAccess *baseAccess;
  Texture2DView TVar4;
  ConstPixelBufferAccess local_60;
  int local_34;
  Sampler *pSStack_30;
  int levelNdx;
  Sampler *sampler_local;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *storage_local;
  Texture2DView *src_local;
  Texture2DView view;
  
  pSStack_30 = sampler;
  sampler_local = (Sampler *)storage;
  storage_local =
       (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)src;
  iVar1 = Texture2DView::getNumLevels(src);
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
            (storage,(long)iVar1);
  iVar1 = Texture2DView::getNumLevels((Texture2DView *)storage_local);
  pvVar3 = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
           operator[]((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                       *)sampler_local,0);
  Texture2DView::Texture2DView((Texture2DView *)&src_local,iVar1,pvVar3);
  local_34 = 0;
  while( true ) {
    iVar1 = local_34;
    iVar2 = Texture2DView::getNumLevels((Texture2DView *)storage_local);
    if (iVar2 <= iVar1) break;
    baseAccess = Texture2DView::getLevel((Texture2DView *)storage_local,local_34);
    getEffectiveDepthStencilAccess(&local_60,baseAccess,pSStack_30->depthStencilMode);
    pvVar3 = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ::operator[]((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           *)sampler_local,(long)local_34);
    memcpy(pvVar3,&local_60,0x28);
    local_34 = local_34 + 1;
  }
  TVar4._4_4_ = 0;
  TVar4.m_numLevels = (uint)src_local;
  TVar4.m_levels = (ConstPixelBufferAccess *)view._0_8_;
  return TVar4;
}

Assistant:

ViewType getEffectiveTView (const ViewType& src, std::vector<tcu::ConstPixelBufferAccess>& storage, const tcu::Sampler& sampler)
{
	storage.resize(src.getNumLevels());

	ViewType view = ViewType(src.getNumLevels(), &storage[0]);

	for (int levelNdx = 0; levelNdx < src.getNumLevels(); ++levelNdx)
		storage[levelNdx] = tcu::getEffectiveDepthStencilAccess(src.getLevel(levelNdx), sampler.depthStencilMode);

	return view;
}